

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O2

void __thiscall
BipartiteGraph::BipartiteGraph
          (BipartiteGraph *this,
          vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
          *IncidenceMatrix,vector<double,_std::allocator<double>_> *Aweight,
          vector<double,_std::allocator<double>_> *Bweight)

{
  pointer pdVar1;
  ulong uVar2;
  pointer pdVar3;
  size_type __n;
  double dbl;
  double local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->edge,IncidenceMatrix);
  __n = (long)(Aweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(Aweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3;
  this->nA = __n;
  uVar2 = (long)(Bweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Bweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  this->nB = uVar2;
  if (uVar2 < __n) {
    uVar2 = __n;
  }
  (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = uVar2;
  local_38 = Bweight;
  std::vector<Vertex,_std::allocator<Vertex>_>::reserve(&this->Avertex,__n);
  std::vector<Vertex,_std::allocator<Vertex>_>::reserve(&this->Bvertex,this->nB);
  pdVar1 = (Aweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (Aweight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    local_40 = *pdVar3;
    std::vector<Vertex,std::allocator<Vertex>>::emplace_back<double&>
              ((vector<Vertex,std::allocator<Vertex>> *)&this->Avertex,&local_40);
  }
  pdVar1 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    local_40 = *pdVar3;
    std::vector<Vertex,std::allocator<Vertex>>::emplace_back<double&>
              ((vector<Vertex,std::allocator<Vertex>> *)&this->Bvertex,&local_40);
  }
  return;
}

Assistant:

BipartiteGraph::BipartiteGraph(vector<deque<bool>>& IncidenceMatrix, const vector<double>& Aweight, const vector<double>& Bweight) : edge(IncidenceMatrix), nA(Aweight.size()), nB(Bweight.size()) {
    this->n = max(nA, nB);
    Avertex.reserve(nA);
    Bvertex.reserve(nB);
    for (auto dbl : Aweight)
        Avertex.emplace_back(dbl);
    for (auto dbl : Bweight)
        Bvertex.emplace_back(dbl);
}